

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RatioSequence.cpp
# Opt level: O1

string * __thiscall
RatioSequence::toString_abi_cxx11_(string *__return_storage_ptr__,RatioSequence *this)

{
  string *psVar1;
  ostream *poVar2;
  pointer pRVar3;
  long lVar4;
  ulong uVar5;
  pointer pRVar6;
  ostringstream ss;
  string local_1d0;
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pRVar6 = (this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar3 = (this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pRVar3 - (long)pRVar6 != 0x40) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      Ratio::toString_abi_cxx11_(&local_1d0,(Ratio *)((long)&pRVar6->eLength + lVar4));
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      uVar5 = uVar5 + 1;
      pRVar6 = (this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
               super__Vector_impl_data._M_start;
      pRVar3 = (this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar4 = lVar4 + 0x40;
    } while (uVar5 < ((long)pRVar3 - (long)pRVar6 >> 6) - 1U);
  }
  Ratio::toString_abi_cxx11_(&local_1d0,pRVar3 + -1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  psVar1 = local_1b0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

string RatioSequence::toString() {
    ostringstream ss;
    for (size_t i = 0; i < _RatioSequence.size() - 1; ++i) {
        ss << _RatioSequence[i].toString() << " ";
    }
    ss << _RatioSequence.back().toString();
    return ss.str();
}